

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall
DCanvas::DrawTexture(DCanvas *this,FTexture *img,double x,double y,int tags_first,...)

{
  bool bVar1;
  undefined1 local_120 [7];
  bool res;
  DrawParms parms;
  va_list tags;
  int tags_first_local;
  double y_local;
  double x_local;
  FTexture *img_local;
  DCanvas *this_local;
  
  parms.fortext = true;
  parms.virtBottom = false;
  parms._214_2_ = 0;
  parms.maxstrlen = 0x18;
  bVar1 = ParseDrawTextureTags
                    (this,img,x,y,tags_first,(__va_list_tag *)&parms.maxstrlen,
                     (DrawParms *)local_120,false);
  if (bVar1) {
    (*(this->super_DObject)._vptr_DObject[0x18])(this,img,local_120);
  }
  return;
}

Assistant:

void DCanvas::DrawTexture (FTexture *img, double x, double y, int tags_first, ...)
{
	va_list tags;
	va_start(tags, tags_first);
	DrawParms parms;

	bool res = ParseDrawTextureTags(img, x, y, tags_first, tags, &parms, false);
	va_end(tags);
	if (!res)
	{
		return;
	}
	DrawTextureParms(img, parms);
}